

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O3

void __thiscall helics::helicsCLI11App::~helicsCLI11App(helicsCLI11App *this)

{
  (this->super_App)._vptr_App = (_func_int **)&PTR__helicsCLI11App_004c9200;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->remArgs);
  CLI::std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->cbacks);
  CLI::App::~App(&this->super_App);
  operator_delete(this,0x3a0);
  return;
}

Assistant:

explicit helicsCLI11App(std::string app_description = "", const std::string& app_name = ""):
        CLI::App(std::move(app_description), app_name, nullptr)
    {
        set_help_flag("-h,-?,--help", "Print this help message and exit");
        set_config("--config-file,--config",
                   "helics_config.toml",
                   "specify base configuration file");
        set_version_flag("--version", helics::versionString);
        add_option_group("quiet")->immediate_callback()->add_flag("--quiet",
                                                                  quiet,
                                                                  "silence most print output");
    }